

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O3

void __thiscall
CompressedArray::const_iterator::switch_to_record(const_iterator *this,uint32_t record_index)

{
  CompressedArray *pCVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  uint32_t block_index;
  const_iterator local_50;
  
  pCVar1 = this->array;
  if (pCVar1->record_count < record_index) {
    record_index = pCVar1->record_count;
  }
  pBVar2 = (pCVar1->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar4 = pBVar2;
  uVar6 = (long)(pCVar1->headers).
                super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4;
  while (pBVar3 = pBVar4, 0 < (long)uVar6) {
    uVar5 = uVar6 >> 1;
    uVar6 = ~uVar5 + uVar6;
    pBVar4 = pBVar3 + uVar5 + 1;
    if (record_index < pBVar3[uVar5].record_index) {
      pBVar4 = pBVar3;
      uVar6 = uVar5;
    }
  }
  block_index = (uint32_t)((ulong)((long)pBVar3 + (-0x10 - (long)pBVar2)) >> 4);
  switch_to_block(this,block_index);
  if ((this->block_index == block_index) && (this->record_index < record_index)) {
    do {
      operator++(&local_50,this);
      if (this->block_index != block_index) {
        return;
      }
    } while (this->record_index < record_index);
  }
  return;
}

Assistant:

void CompressedArray::const_iterator::switch_to_record(uint32_t record_index) {
    if (record_index > array->record_count)
        record_index = array->record_count;

    BlockHeader header;
    header.record_index = record_index;
    auto it = upper_bound(array->headers.begin(), array->headers.end(), header,
                          [](const BlockHeader& first, const BlockHeader& second) {
                              return first.record_index < second.record_index;
                          });
    --it;

    uint32_t block_index = uint32_t(it - array->headers.begin());
    switch_to_block(block_index);
    while (this->block_index == block_index && this->record_index < record_index)
        (*this)++;
}